

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_copyWithin(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  long count;
  JSValue obj;
  JSValue val;
  int64_t final;
  int64_t to;
  int64_t from;
  int64_t len;
  long local_58;
  JSValueUnion local_50;
  long local_48;
  long local_40;
  int64_t local_38;
  
  obj = JS_ToObject(ctx,this_val);
  JVar2 = obj.u;
  iVar1 = js_get_length64(ctx,&local_38,obj);
  if ((((iVar1 == 0) &&
       (iVar1 = JS_ToInt64Clamp(ctx,&local_48,*argv,0,local_38,local_38), iVar1 == 0)) &&
      (iVar1 = JS_ToInt64Clamp(ctx,&local_40,argv[1],0,local_38,local_38), iVar1 == 0)) &&
     (((local_58 = local_38, argc < 3 || ((int)argv[2].tag == 3)) ||
      (val.tag = argv[2].tag, val.u.ptr = argv[2].u.ptr,
      iVar1 = JS_ToInt64Clamp(ctx,&local_58,val,0,local_38,local_38), iVar1 == 0)))) {
    count = local_38 - local_48;
    if (local_58 - local_40 < local_38 - local_48) {
      count = local_58 - local_40;
    }
    iVar1 = JS_CopySubArray(ctx,obj,local_48,local_40,count,
                            -(uint)(local_48 < count + local_40 && local_40 < local_48) | 1);
    if (iVar1 == 0) {
      return obj;
    }
  }
  if ((0xfffffff4 < (uint)obj.tag) &&
     (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    local_50 = JVar2;
    __JS_FreeValueRT(ctx->rt,obj);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_copyWithin(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    JSValue obj;
    int64_t len, from, to, final, count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    if (JS_ToInt64Clamp(ctx, &to, argv[0], 0, len, len))
        goto exception;

    if (JS_ToInt64Clamp(ctx, &from, argv[1], 0, len, len))
        goto exception;

    final = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt64Clamp(ctx, &final, argv[2], 0, len, len))
            goto exception;
    }

    count = min_int64(final - from, len - to);

    if (JS_CopySubArray(ctx, obj, to, from, count,
                        (from < to && to < from + count) ? -1 : +1))
        goto exception;

    return obj;

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}